

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O0

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::removeAllOperands(SubgraphNode<dg::pta::PSNode> *this)

{
  bool bVar1;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  *in_RDI;
  PSNode *in_stack_00000008;
  PSNode *o;
  iterator __end0;
  iterator __begin0;
  NodesVec *__range2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_18;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  *local_10;
  
  local_10 = in_RDI + 10;
  local_18._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end(in_stack_ffffffffffffffc8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator*(&local_18);
    removeUser((SubgraphNode<dg::pta::PSNode> *)o,in_stack_00000008);
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::clear
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x15dbc2);
  return;
}

Assistant:

void removeAllOperands() {
        for (auto *o : operands) {
            o->removeUser(static_cast<NodeT *>(this));
        }
        operands.clear();
    }